

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_supported_versions_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *pSVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  CBB versions;
  CBB contents;
  
  if (hs->max_version < 0x304) {
    return true;
  }
  pSVar1 = hs->ssl;
  if (0x303 < hs->min_version) {
    out = out_compressible;
  }
  iVar4 = CBB_add_u16(out,0x2b);
  if (((iVar4 == 0) || (iVar4 = CBB_add_u16_length_prefixed(out,&contents), iVar4 == 0)) ||
     (iVar4 = CBB_add_u8_length_prefixed(&contents,&versions), iVar4 == 0)) {
    return false;
  }
  if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
    uVar3 = ssl_get_grease_value(hs,ssl_grease_version);
    iVar4 = CBB_add_u16(&versions,uVar3);
    if (iVar4 == 0) {
      return false;
    }
  }
  uVar3 = 0x304;
  if (type != ssl_client_hello_inner) {
    uVar3 = 0;
  }
  bVar2 = ssl_add_supported_versions(hs,&versions,uVar3);
  if (bVar2) {
    iVar4 = CBB_flush(out);
    return iVar4 != 0;
  }
  return false;
}

Assistant:

static bool ext_supported_versions_add_clienthello(
    const SSL_HANDSHAKE *hs, CBB *out, CBB *out_compressible,
    ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (hs->max_version <= TLS1_2_VERSION) {
    return true;
  }

  // supported_versions is compressible in ECH if ClientHelloOuter already
  // requires TLS 1.3. Otherwise the extensions differ in the older versions.
  if (hs->min_version >= TLS1_3_VERSION) {
    out = out_compressible;
  }

  CBB contents, versions;
  if (!CBB_add_u16(out, TLSEXT_TYPE_supported_versions) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &versions)) {
    return false;
  }

  // Add a fake version. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !CBB_add_u16(&versions, ssl_get_grease_value(hs, ssl_grease_version))) {
    return false;
  }

  // Encrypted ClientHellos requires TLS 1.3 or later.
  uint16_t extra_min_version =
      type == ssl_client_hello_inner ? TLS1_3_VERSION : 0;
  if (!ssl_add_supported_versions(hs, &versions, extra_min_version) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}